

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O3

int64_t duckdb::DateDiff::QuarterOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
                  (dtime_t startdate,dtime_t enddate)

{
  NotImplementedException *this;
  string local_40;
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"\"time\" units \"quarter\" not recognized","");
  NotImplementedException::NotImplementedException(this,&local_40);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t DateDiff::QuarterOperator::Operation(dtime_t startdate, dtime_t enddate) {
	throw NotImplementedException("\"time\" units \"quarter\" not recognized");
}